

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O0

void CVmBifNet::send_net_request(uint argc)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  vm_val_t *pvVar5;
  CVmDataSource *reply;
  uint in_EDI;
  char *in_stack_00000028;
  int32_t in_stack_00000034;
  HttpReqThread *th;
  char *body_type;
  vm_val_t *body;
  char *hdrs;
  int32_t options;
  char *verb;
  size_t lurll;
  char *lurl;
  char *image_url;
  size_t urll;
  char *url;
  vm_val_t *id;
  int server_level;
  int client_level;
  vm_rcdesc rc;
  vm_val_t *in_stack_ffffffffffffff08;
  vm_val_t *in_stack_ffffffffffffff10;
  vm_val_t *in_stack_ffffffffffffff18;
  OS_Thread *this;
  vm_bif_desc *in_stack_ffffffffffffff20;
  CCharmapToLocal *in_stack_ffffffffffffff28;
  vm_rcdesc *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  CVmWeakRefable *this_00;
  CVmWeakRefable *pCVar6;
  HttpReqThread *this_01;
  void *local_88;
  char *local_80;
  undefined1 local_60 [4];
  int local_5c;
  OS_Thread local_58;
  int status;
  
  CVmBif::check_argc_range
            ((uint)((ulong)in_stack_ffffffffffffff10 >> 0x20),(uint)in_stack_ffffffffffffff10,
             (uint)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  CVmStack::get(0);
  vm_rcdesc::vm_rcdesc
            (in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),in_stack_ffffffffffffff10,
             (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  (*G_host_ifc_X->_vptr_CVmHostIfc[5])(G_host_ifc_X,&local_5c,local_60);
  if (1 < local_5c) {
    err_throw(0);
  }
  CVmStack::get(0);
  CVmStack::get(1);
  pcVar2 = CVmBif::get_str_val(in_stack_ffffffffffffff18);
  sVar3 = vmb_get_len((char *)0x251645);
  local_80 = "<image URL unknown>";
  if (G_net_config_X != (TadsNetConfig *)0x0) {
    local_80 = TadsNetConfig::get((TadsNetConfig *)in_stack_ffffffffffffff20,
                                  (char *)in_stack_ffffffffffffff18,
                                  (char *)in_stack_ffffffffffffff10);
  }
  sVar4 = CCharmapToLocal::map_utf8_alo
                    (in_stack_ffffffffffffff28,(char **)in_stack_ffffffffffffff20,
                     (char *)in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10);
  vm_log_fmt("client request to %.*s by %s",sVar4 & 0xffffffff,local_88,local_80);
  free(local_88);
  if ((6 < sVar3) &&
     ((iVar1 = memcmp(pcVar2 + 2,"http://",7), iVar1 == 0 ||
      (*(long *)(pcVar2 + 2) == 0x2f2f3a7370747468)))) {
    if ((local_5c == 1) &&
       ((iVar1 = match_url_domain((char *)in_stack_ffffffffffffff28,
                                  (size_t)in_stack_ffffffffffffff20,
                                  (char *)in_stack_ffffffffffffff18), iVar1 == 0 &&
        (iVar1 = match_url_domain((char *)in_stack_ffffffffffffff28,
                                  (size_t)in_stack_ffffffffffffff20,
                                  (char *)in_stack_ffffffffffffff18), iVar1 == 0)))) {
      err_throw(0);
    }
    CVmStack::get(2);
    CVmBif::get_str_val(in_stack_ffffffffffffff18);
    if ((3 < in_EDI) && (pvVar5 = CVmStack::get(3), pvVar5->typ != VM_NIL)) {
      CVmStack::get(3);
      vm_val_t::num_to_int(in_stack_ffffffffffffff10);
    }
    if ((4 < in_EDI) && (pvVar5 = CVmStack::get(4), pvVar5->typ != VM_NIL)) {
      CVmStack::get(4);
      CVmBif::get_str_val(in_stack_ffffffffffffff18);
    }
    this_01 = (HttpReqThread *)0x0;
    if ((5 < in_EDI) && (pvVar5 = CVmStack::get(5), pvVar5->typ != VM_NIL)) {
      this_01 = (HttpReqThread *)CVmStack::get(5);
      pcVar2 = vm_val_t::get_as_string(in_stack_ffffffffffffff08);
      if ((pcVar2 == (char *)0x0) &&
         ((*(vm_datatype_t *)
            &(this_01->super_OS_Thread).super_CVmWeakRefable.super_CVmRefCntObj._vptr_CVmRefCntObj
           != VM_OBJ ||
          ((iVar1 = CVmObjByteArray::is_byte_array(0), iVar1 == 0 &&
           (iVar1 = CVmObjLookupTable::is_lookup_table_obj(0), iVar1 == 0)))))) {
        err_throw(0);
      }
    }
    this_00 = (CVmWeakRefable *)0x0;
    if ((6 < in_EDI) && (pvVar5 = CVmStack::get(6), pvVar5->typ != VM_NIL)) {
      CVmStack::get(6);
      this_00 = (CVmWeakRefable *)CVmBif::get_str_val(in_stack_ffffffffffffff18);
    }
    reply = (CVmDataSource *)operator_new(0x90);
    this = &local_58;
    pCVar6 = this_00;
    HttpReqThread::HttpReqThread
              ((HttpReqThread *)hdrs,body,body_type,(char *)th,in_stack_00000034,in_stack_00000028,
               (vm_val_t *)verb,(char *)lurll,(vm_rcdesc *)lurl);
    status = (int)((ulong)pCVar6 >> 0x20);
    iVar1 = OS_Thread::launch(this);
    if (iVar1 == 0) {
      HttpReqThread::post_result
                (this_01,status,reply,in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30);
    }
    CVmWeakRefable::release_ref(this_00);
    CVmStack::discard(in_EDI);
    CVmBif::retval_nil();
    return;
  }
  err_throw(0);
}

Assistant:

void CVmBifNet::send_net_request(VMG_ uint argc)
{
    /* check arguments - we need (id, url), and after that it varies */
    check_argc_range(vmg_ argc, 2, 32767);

    /* 
     *   set up a recursive VM context, in case we need it (we might, for
     *   evaluating FileUpload properties in a form body lookup table) 
     */
    vm_rcdesc rc(vmg_ "sendNetRequest", CVmBifNet::bif_table, 6, 
                 G_stk->get(0), argc);

    /* get the network safety levels */
    int client_level, server_level;
    G_host_ifc->get_net_safety(&client_level, &server_level);

    /* if the client safety level doesn't allow client operations, fail */
    if (client_level >= VM_NET_SAFETY_MAXIMUM)
        err_throw(VMERR_NETWORK_SAFETY);

    /* retrieve the ID value - any type is allowed here */
    vm_val_t *id = G_stk->get(0);

    /* retrieve the URL - this must be a string */
    const char *url = get_str_val(vmg_ G_stk->get(1));
    size_t urll = vmb_get_len(url);
    url += VMB_LEN;

    /* get the image URL, for logging purposes */
    const char *image_url = "<image URL unknown>";
    if (G_net_config != 0)
        image_url = G_net_config->get("image.url", "<image URL unknown>");

    /* map the URL to the local file character set */
    char *lurl;
    size_t lurll = G_cmap_to_file->map_utf8_alo(&lurl, url, urll);
    
    /* log the request */
    vm_log_fmt(vmg_ "client request to %.*s by %s",
               (int)lurll, lurl, image_url);

    /* done with the local version of the URL */
    t3free(lurl);

    /* check the protocol */
    if (urll >= 7
        && (memcmp(url, "http://", 7) == 0
            || memcmp(url, "https://", 8) == 0))
    {
        /* HTTP or HTTPS */

        /* 
         *   if we're restricted to local access, verify that the domain is
         *   "localhost" or "127.0.0.1"
         */
        if (client_level == VM_NET_SAFETY_LOCALHOST)
        {
            /* get a pointer to the domain */
            if (!match_url_domain(url, urll, "localhost")
                && !match_url_domain(url, urll, "127.0.0.1"))
                err_throw(VMERR_NETWORK_SAFETY);
        }

        /* get the verb - this must be a string */
        const char *verb = get_str_val(vmg_ G_stk->get(2));

        /* get the option flags, if present */
        int32_t options = 0;
        if (argc >= 4 && G_stk->get(3)->typ != VM_NIL)
            options = G_stk->get(3)->num_to_int(vmg0_);

        /* get the headers, if present */
        const char *hdrs = 0;
        if (argc >= 5 && G_stk->get(4)->typ != VM_NIL)
            hdrs = get_str_val(vmg_ G_stk->get(4));

        /* get the content body, if present */
        vm_val_t *body = 0;
        if (argc >= 6 && G_stk->get(5)->typ != VM_NIL)
        {
            /* get the body value */
            body = G_stk->get(5);

            /* 
             *   verify the body type - this must be a string, byte array, or
             *   lookup table 
             */
            if (body->get_as_string(vmg0_) != 0
                || (body->typ == VM_OBJ
                    && (CVmObjByteArray::is_byte_array(vmg_ body->val.obj)
                        || CVmObjLookupTable::is_lookup_table_obj(
                            vmg_ body->val.obj))))
            {
                /* acceptable body type */
            }
            else
            {
                /* invalid body type */
                err_throw(VMERR_BAD_TYPE_BIF);
            }
        }

        /* get the body's MIME type, if present */
        const char *body_type = 0;
        if (argc >= 7 && G_stk->get(6)->typ != VM_NIL)
            body_type = get_str_val(vmg_ G_stk->get(6));

        /* create the request processor thread */
        HttpReqThread *th = new HttpReqThread(
            vmg_ id, url - VMB_LEN, verb, options, hdrs, body, body_type, &rc);

        /* launch the thread */
        if (!th->launch())
        {
            /* 
             *   We couldn't launch the thread - post a result event
             *   indicating failure.  We have to post the result event
             *   ourselves because (a) a result event always has to be
             *   posted, even when the request fails, as it's the way that we
             *   transmit all status information back to the caller, and (b)
             *   the thread would normally post the result, but it won't be
             *   doing so because it never got started.
             */
            th->post_result(OS_HttpClient::ErrThread, 0, 0, 0);
        }

        /* done with the thread object */
        th->release_ref();
    }
    else
    {
        /* unknown protocol - it's an error */
        err_throw(VMERR_BAD_VAL_BIF);
    }

    /* pop the arguments */
    G_stk->discard(argc);

    /* there's no return value, but return nil to clear out any old data */
    retval_nil(vmg0_);
}